

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O0

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,QLatin1StringView str)

{
  QLatin1StringView s;
  QLatin1StringView in;
  bool bVar1;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  qsizetype written;
  QVarLengthArray<char,_256LL> utf8;
  char *in_stack_fffffffffffffe58;
  QCborStreamWriter *in_stack_fffffffffffffe60;
  QVarLengthArray<char,_256LL> *pQVar2;
  QVarLengthArray<char,_256LL> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe88;
  QLatin1String local_130;
  QVarLengthArray<char,_256LL> local_120;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s.m_data = in_stack_fffffffffffffe78;
  s.m_size = (qsizetype)in_stack_fffffffffffffe70;
  bVar1 = QtPrivate::isAscii(s);
  if (bVar1) {
    QLatin1String::latin1(&local_130);
    QLatin1String::size(&local_130);
    appendTextString(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,0x8de2af);
  }
  else {
    pQVar2 = &local_120;
    memset(pQVar2,0xaa,0x118);
    QLatin1String::size(&local_130);
    QVarLengthArray<char,_256LL>::QVarLengthArray(in_stack_fffffffffffffe70,(qsizetype)pQVar2);
    QVLABase<char>::data(&pQVar2->super_QVLABase<char>);
    in.m_data = in_stack_fffffffffffffe88;
    in.m_size = in_RDI;
    QUtf8::convertFromLatin1(in_stack_fffffffffffffe78,in);
    pQVar2 = &local_120;
    QVLABase<char>::data(&pQVar2->super_QVLABase<char>);
    QVLABase<char>::data(&pQVar2->super_QVLABase<char>);
    appendTextString((QCborStreamWriter *)pQVar2,in_stack_fffffffffffffe58,0x8de355);
    QVarLengthArray<char,_256LL>::~QVarLengthArray(pQVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(QLatin1StringView str)
{
    // We've got Latin-1 but CBOR wants UTF-8, so check if the string is the
    // common subset (US-ASCII).
    if (QtPrivate::isAscii(str)) {
        // it is plain US-ASCII
        appendTextString(str.latin1(), str.size());
    } else {
        // non-ASCII, convert:
        QVarLengthArray<char> utf8(str.size() * 2); // each L1 char gives at most two U8 units
        const qsizetype written = QUtf8::convertFromLatin1(utf8.data(), str) - utf8.data();
        appendTextString(utf8.data(), written);
    }
}